

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O2

expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
tinyusdz::anon_unknown_0::ExpandWithIndices<tinyusdz::value::texcoord3h>
          (expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *values,
          uint32_t elementSize,vector<int,_std::allocator<int>_> *indices,
          vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *dest)

{
  uint uVar1;
  pointer piVar2;
  pointer piVar3;
  pointer ptVar4;
  pointer ptVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  value_type_conflict vVar9;
  long lVar10;
  ulong uVar11;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> invalidIndices;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (dest == (vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_> *)
              0x0) {
    local_a8.m_error._M_dataplus._M_p = "`dest` is nullptr.";
    nonstd::expected_lite::
    expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_a8);
  }
  else {
    piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar2 == piVar3) {
      std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
      operator=(dest,values);
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = true;
    }
    else {
      uVar6 = (ulong)elementSize;
      if ((elementSize != 0) &&
         ((ulong)(((long)(values->
                         super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(values->
                        super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                        )._M_impl.super__Vector_impl_data._M_start) / 6) % uVar6 == 0)) {
        std::vector<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>::
        resize(dest,((long)piVar3 - (long)piVar2 >> 2) * uVar6);
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vVar9 = true;
        for (local_a8.m_error._M_dataplus._M_p = (pointer)0x0;
            piVar2 = (indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
            local_a8.m_error._M_dataplus._M_p <
            (undefined1 *)
            ((long)(indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
            local_a8.m_error._M_dataplus._M_p = local_a8.m_error._M_dataplus._M_p + 1) {
          uVar1 = piVar2[(long)local_a8.m_error._M_dataplus._M_p];
          if (((int)uVar1 < 0) ||
             (uVar11 = ((ulong)uVar1 + 1) * uVar6,
             uVar7 = ((long)(values->
                            super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(values->
                           super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                           )._M_impl.super__Vector_impl_data._M_start) / 6,
             uVar7 <= uVar11 && uVar11 - uVar7 != 0)) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      (&invalidIndices,(value_type_conflict5 *)&local_a8);
            vVar9 = false;
          }
          else {
            lVar10 = (ulong)uVar1 * uVar6 * 6;
            for (lVar8 = 0; uVar6 * 6 - lVar8 != 0; lVar8 = lVar8 + 6) {
              ptVar4 = (values->
                       super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              ptVar5 = (dest->
                       super__Vector_base<tinyusdz::value::texcoord3h,_std::allocator<tinyusdz::value::texcoord3h>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              *(undefined2 *)
               ((long)&ptVar5[(long)local_a8.m_error._M_dataplus._M_p * uVar6].r.value + lVar8) =
                   *(undefined2 *)((long)&(ptVar4->r).value + lVar8 + lVar10);
              *(undefined4 *)
               ((long)&ptVar5[(long)local_a8.m_error._M_dataplus._M_p * uVar6].s.value + lVar8) =
                   *(undefined4 *)((long)&(ptVar4->s).value + lVar8 + lVar10);
            }
          }
        }
        if (invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish ==
            invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start) {
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_has_value = true;
          (__return_storage_ptr__->contained).
          super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .field_0.m_value = vVar9;
        }
        else {
          tinyusdz::value::print_array_snipped<unsigned_long>(&local_50,&invalidIndices,5);
          std::operator+(&local_70,"Invalid indices found: ",&local_50);
          local_a8.m_error._M_dataplus._M_p = (pointer)&local_a8.m_error.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) {
            local_a8.m_error.field_2._8_8_ = local_70.field_2._8_8_;
          }
          else {
            local_a8.m_error._M_dataplus._M_p = local_70._M_dataplus._M_p;
          }
          local_a8.m_error._M_string_length = local_70._M_string_length;
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          nonstd::expected_lite::
          expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (__return_storage_ptr__,&local_a8);
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&invalidIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  );
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<bool, std::string> ExpandWithIndices(
    const std::vector<T> &values, uint32_t elementSize, const std::vector<int32_t> &indices,
    std::vector<T> *dest) {
  if (!dest) {
    return nonstd::make_unexpected("`dest` is nullptr.");
  }

  if (indices.empty()) {
    (*dest) = values;
    return true;
  }

  if (elementSize == 0) {
    return false;
  }

  if ((values.size() % elementSize) != 0) {
    return false;
  }

  dest->resize(indices.size() * elementSize);

  std::vector<size_t> invalidIndices;

  bool valid = true;
  for (size_t i = 0; i < indices.size(); i++) {
    int32_t idx = indices[i];
    if ((idx >= 0) && ((size_t(idx+1) * size_t(elementSize)) <= values.size())) {
      for (size_t k = 0; k < elementSize; k++) {
        (*dest)[i*elementSize + k] = values[size_t(idx)*elementSize + k];
      }
    } else {
      invalidIndices.push_back(i);
      valid = false;
    }
  }

  if (invalidIndices.size()) {
    return nonstd::make_unexpected(
        "Invalid indices found: " +
        value::print_array_snipped(invalidIndices,
                                   /* N to display */ 5));
  }

  return valid;
}